

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VtabCallDestroy(sqlite3 *db,int iDb,char *zTab)

{
  sqlite3 *psVar1;
  VTable *pVVar2;
  int iVar3;
  Table *pTVar4;
  VTable *pVVar5;
  VTable **ppVVar6;
  VTable *pVVar7;
  VTable **ppVVar8;
  VTable *pVTab;
  
  pTVar4 = sqlite3FindTable(db,zTab,db->aDb[iDb].zName);
  iVar3 = 0;
  if ((pTVar4 != (Table *)0x0) && (pVVar5 = pTVar4->pVTable, pVVar5 != (VTable *)0x0)) {
    ppVVar8 = &pTVar4->pVTable;
    *ppVVar8 = (VTable *)0x0;
    pVTab = (VTable *)0x0;
    do {
      psVar1 = pVVar5->db;
      if (psVar1 == db) {
        pVVar7 = (VTable *)0x0;
        ppVVar6 = ppVVar8;
        pVTab = pVVar5;
      }
      else {
        pVVar7 = psVar1->pDisconnect;
        ppVVar6 = &psVar1->pDisconnect;
      }
      pVVar2 = pVVar5->pNext;
      *ppVVar6 = pVVar5;
      pVVar5->pNext = pVVar7;
      pVVar5 = pVVar2;
    } while (pVVar2 != (VTable *)0x0);
    iVar3 = (*pVTab->pMod->pModule->xDestroy)(pVTab->pVtab);
    if (iVar3 == 0) {
      iVar3 = 0;
      pVTab->pVtab = (sqlite3_vtab *)0x0;
      *ppVVar8 = (VTable *)0x0;
      sqlite3VtabUnlock(pVTab);
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabCallDestroy(sqlite3 *db, int iDb, const char *zTab){
  int rc = SQLITE_OK;
  Table *pTab;

  pTab = sqlite3FindTable(db, zTab, db->aDb[iDb].zName);
  if( ALWAYS(pTab!=0 && pTab->pVTable!=0) ){
    VTable *p = vtabDisconnectAll(db, pTab);

    assert( rc==SQLITE_OK );
    rc = p->pMod->pModule->xDestroy(p->pVtab);

    /* Remove the sqlite3_vtab* from the aVTrans[] array, if applicable */
    if( rc==SQLITE_OK ){
      assert( pTab->pVTable==p && p->pNext==0 );
      p->pVtab = 0;
      pTab->pVTable = 0;
      sqlite3VtabUnlock(p);
    }
  }

  return rc;
}